

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QMimeData * __thiscall QListWidget::mimeData(QListWidget *this,QList<QListWidgetItem_*> *items)

{
  QListWidgetPrivate *this_00;
  QListWidgetItem **ppQVar1;
  long lVar2;
  QListModel *pQVar3;
  QMimeData *pQVar4;
  QModelIndexList *this_01;
  long lVar5;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListWidgetPrivate **)
             &(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  pQVar3 = QListWidgetPrivate::listModel(this_00);
  if ((pQVar3->cachedIndexes).d.size == 0) {
    this_01 = &pQVar3->cachedIndexes;
    QList<QModelIndex>::reserve(this_01,(items->d).size);
    ppQVar1 = (items->d).ptr;
    lVar2 = (items->d).size;
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      indexFromItem(&local_50,this,*(QListWidgetItem **)((long)ppQVar1 + lVar5));
      QList<QModelIndex>::emplaceBack<QModelIndex>(this_01,&local_50);
    }
    pQVar3 = QListWidgetPrivate::listModel(this_00);
    pQVar4 = QListModel::internalMimeData(pQVar3);
    QList<QModelIndex>::clear(this_01);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pQVar4;
    }
  }
  else {
    pQVar3 = QListWidgetPrivate::listModel(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar4 = QListModel::internalMimeData(pQVar3);
      return pQVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListWidget::mimeData(const QList<QListWidgetItem *> &items) const
{
    Q_D(const QListWidget);

    QModelIndexList &cachedIndexes = d->listModel()->cachedIndexes;

    // if non empty, it's called from the model's own mimeData
    if (cachedIndexes.isEmpty()) {
        cachedIndexes.reserve(items.size());
        for (QListWidgetItem *item : items)
            cachedIndexes << indexFromItem(item);

        QMimeData *result = d->listModel()->internalMimeData();

        cachedIndexes.clear();
        return result;
    }

    return d->listModel()->internalMimeData();
}